

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O1

bool __thiscall
Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(MakeVerboseFormatProcess *this,aiMesh *pcMesh)

{
  vector<aiVertexWeight,std::allocator<aiVertexWeight>> *this_00;
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  iterator __position;
  aiVector3D *paVar4;
  undefined8 uVar5;
  aiVertexWeight aVar6;
  float fVar7;
  ulong *puVar8;
  aiVector3D *paVar9;
  void *pvVar10;
  aiBone *paVar11;
  aiVertexWeight *paVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong *puVar17;
  aiFace *paVar18;
  ulong uVar19;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *this_01;
  ulong uVar20;
  aiVertexWeight wNew;
  aiColor4D *apvColorSets [8];
  aiVector3D *apvTextureCoords [8];
  aiVertexWeight local_110;
  ulong local_108;
  aiVector3D *local_100;
  aiVector3D *local_f8;
  aiVector3D *local_f0;
  uint local_e4;
  aiVector3D *local_e0;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *local_d8;
  ulong *local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8 [17];
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("__null != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                  ,0x59,"bool Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh *)");
  }
  uVar16 = pcMesh->mNumVertices;
  uVar2 = pcMesh->mNumFaces;
  uVar20 = (ulong)(uVar2 * 3);
  uVar19 = uVar20 * 0xc;
  paVar9 = (aiVector3D *)operator_new__(uVar19);
  if (uVar2 != 0) {
    memset(paVar9,0,((uVar20 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  if (uVar16 == 0 || pcMesh->mNormals == (aiVector3D *)0x0) {
    local_f0 = (aiVector3D *)0x0;
  }
  else {
    local_f0 = (aiVector3D *)operator_new__(uVar19);
    if (uVar2 != 0) {
      memset(local_f0,0,((uVar20 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
  }
  local_108 = uVar20;
  local_e0 = paVar9;
  if ((pcMesh->mBitangents == (aiVector3D *)0x0 || pcMesh->mTangents == (aiVector3D *)0x0) ||
      uVar16 == 0) {
    local_100 = (aiVector3D *)0x0;
    local_f8 = (aiVector3D *)0x0;
  }
  else {
    paVar9 = (aiVector3D *)operator_new__(uVar19);
    if (uVar2 != 0) {
      memset(paVar9,0,((uVar20 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    local_100 = (aiVector3D *)operator_new__(uVar19);
    local_f8 = paVar9;
    if (uVar2 != 0) {
      memset(local_100,0,((uVar20 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
  }
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  if (uVar16 != 0) {
    lVar14 = local_108 * 0xc;
    lVar13 = 0;
    do {
      if (pcMesh->mTextureCoords[lVar13] == (aiVector3D *)0x0) break;
      pvVar10 = operator_new__(uVar19);
      if (uVar2 != 0) {
        memset(pvVar10,0,((lVar14 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      local_b8[lVar13 + 8] = (long)pvVar10;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
  }
  if (uVar16 != 0) {
    uVar19 = local_108 << 4;
    lVar14 = 0;
    do {
      if (pcMesh->mColors[lVar14] == (aiColor4D *)0x0) break;
      pvVar10 = operator_new__(uVar19);
      if (uVar2 != 0) {
        memset(pvVar10,0,uVar19);
      }
      local_b8[lVar14] = (long)pvVar10;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 8);
  }
  uVar3 = pcMesh->mNumBones;
  uVar19 = (ulong)uVar3;
  local_d0 = (ulong *)operator_new__(uVar19 * 0x18 + 8);
  *local_d0 = uVar19;
  this_01 = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)(local_d0 + 1);
  if (uVar3 != 0) {
    memset(this_01,0,((uVar19 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  local_e4 = uVar16;
  local_d8 = this_01;
  if (pcMesh->mNumBones != 0) {
    uVar19 = 0;
    do {
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                (this_01,(ulong)(pcMesh->mBones[uVar19]->mNumWeights * 3));
      uVar19 = uVar19 + 1;
      this_01 = this_01 + 1;
    } while (uVar19 < pcMesh->mNumBones);
  }
  local_c8 = (ulong)uVar2;
  if (pcMesh->mNumFaces != 0) {
    uVar19 = 0;
    uVar16 = 0;
    do {
      local_c0 = uVar19;
      if (pcMesh->mFaces[uVar19].mNumIndices != 0) {
        paVar18 = pcMesh->mFaces + uVar19;
        uVar19 = 0;
        do {
          if (pcMesh->mNumBones != 0) {
            uVar20 = 0;
            do {
              paVar11 = pcMesh->mBones[uVar20];
              if (paVar11->mNumWeights != 0) {
                this_00 = (vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                          (local_d8 + uVar20);
                uVar15 = 0;
                do {
                  if (paVar18->mIndices[uVar19] == paVar11->mWeights[uVar15].mVertexId) {
                    local_110.mWeight = paVar11->mWeights[uVar15].mWeight;
                    __position._M_current = *(aiVertexWeight **)(this_00 + 8);
                    local_110.mVertexId = uVar16;
                    if (__position._M_current == *(aiVertexWeight **)(this_00 + 0x10)) {
                      std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                      _M_realloc_insert<aiVertexWeight_const&>(this_00,__position,&local_110);
                    }
                    else {
                      aVar6.mWeight = local_110.mWeight;
                      aVar6.mVertexId = uVar16;
                      *__position._M_current = aVar6;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                    }
                  }
                  uVar15 = uVar15 + 1;
                  paVar11 = pcMesh->mBones[uVar20];
                } while (uVar15 < paVar11->mNumWeights);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < pcMesh->mNumBones);
          }
          paVar9 = pcMesh->mVertices;
          uVar2 = paVar18->mIndices[uVar19];
          uVar20 = (ulong)uVar16;
          local_e0[uVar20].z = paVar9[uVar2].z;
          paVar9 = paVar9 + uVar2;
          fVar7 = paVar9->y;
          local_e0[uVar20].x = paVar9->x;
          local_e0[uVar20].y = fVar7;
          paVar9 = pcMesh->mNormals;
          uVar2 = pcMesh->mNumVertices;
          if (paVar9 != (aiVector3D *)0x0 && uVar2 != 0) {
            uVar3 = paVar18->mIndices[uVar19];
            local_f0[uVar20].z = paVar9[uVar3].z;
            fVar7 = paVar9[uVar3].y;
            local_f0[uVar20].x = paVar9[uVar3].x;
            local_f0[uVar20].y = fVar7;
          }
          paVar9 = pcMesh->mTangents;
          paVar4 = pcMesh->mBitangents;
          if ((paVar4 != (aiVector3D *)0x0 && paVar9 != (aiVector3D *)0x0) && uVar2 != 0) {
            uVar2 = paVar18->mIndices[uVar19];
            local_f8[uVar20].z = paVar9[uVar2].z;
            fVar7 = paVar9[uVar2].y;
            local_f8[uVar20].x = paVar9[uVar2].x;
            local_f8[uVar20].y = fVar7;
            uVar2 = paVar18->mIndices[uVar19];
            local_100[uVar20].z = paVar4[uVar2].z;
            fVar7 = paVar4[uVar2].y;
            local_100[uVar20].x = paVar4[uVar2].x;
            local_100[uVar20].y = fVar7;
          }
          lVar14 = 0;
          do {
            if ((pcMesh->mTextureCoords[lVar14] == (aiVector3D *)0x0) || (pcMesh->mNumVertices == 0)
               ) break;
            paVar9 = pcMesh->mTextureCoords[lVar14];
            uVar2 = paVar18->mIndices[uVar19];
            lVar13 = local_b8[lVar14 + 8];
            *(float *)(lVar13 + 8 + uVar20 * 0xc) = paVar9[uVar2].z;
            *(undefined8 *)(lVar13 + uVar20 * 0xc) = *(undefined8 *)(paVar9 + uVar2);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          lVar14 = 0;
          do {
            if ((pcMesh->mColors[lVar14] == (aiColor4D *)0x0) || (pcMesh->mNumVertices == 0)) break;
            uVar5 = *(undefined8 *)&pcMesh->mColors[lVar14][paVar18->mIndices[uVar19]].b;
            puVar1 = (undefined8 *)(local_b8[lVar14] + uVar20 * 0x10);
            *puVar1 = *(undefined8 *)(pcMesh->mColors[lVar14] + paVar18->mIndices[uVar19]);
            puVar1[1] = uVar5;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          paVar18->mIndices[uVar19] = uVar16;
          uVar19 = uVar19 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar19 < paVar18->mNumIndices);
      }
      uVar19 = local_c0 + 1;
    } while (uVar19 < pcMesh->mNumFaces);
  }
  puVar8 = local_d0;
  if (pcMesh->mNumBones != 0) {
    puVar17 = local_d0 + 2;
    uVar19 = 0;
    do {
      paVar12 = pcMesh->mBones[uVar19]->mWeights;
      if (paVar12 != (aiVertexWeight *)0x0) {
        operator_delete__(paVar12);
      }
      if (puVar17[-1] == *puVar17) {
        pcMesh->mBones[uVar19]->mWeights = (aiVertexWeight *)0x0;
      }
      else {
        uVar15 = *puVar17 - puVar17[-1];
        uVar20 = 0xffffffffffffffff;
        if (-1 < (long)uVar15) {
          uVar20 = uVar15;
        }
        paVar12 = (aiVertexWeight *)operator_new__(uVar20);
        memset(paVar12,0,(uVar15 - 8 & 0xfffffffffffffff8) + 8);
        pcMesh->mBones[uVar19]->mWeights = paVar12;
        memcpy(pcMesh->mBones[uVar19]->mWeights,(void *)puVar17[-1],*puVar17 - (long)puVar17[-1]);
      }
      uVar19 = uVar19 + 1;
      puVar17 = puVar17 + 3;
    } while (uVar19 < pcMesh->mNumBones);
  }
  uVar19 = local_c8;
  if (*puVar8 != 0) {
    lVar14 = *puVar8 * 0x18;
    do {
      pvVar10 = *(void **)((long)puVar8 + lVar14 + -0x10);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10);
      }
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != 0);
  }
  operator_delete__(puVar8);
  uVar16 = local_e4;
  if (pcMesh->mVertices != (aiVector3D *)0x0) {
    operator_delete__(pcMesh->mVertices);
  }
  pcMesh->mVertices = local_e0;
  lVar14 = 0;
  do {
    if ((pcMesh->mTextureCoords[lVar14] == (aiVector3D *)0x0) || (pcMesh->mNumVertices == 0)) break;
    if (pcMesh->mTextureCoords[lVar14] != (aiVector3D *)0x0) {
      operator_delete__(pcMesh->mTextureCoords[lVar14]);
    }
    pcMesh->mTextureCoords[lVar14] = (aiVector3D *)local_b8[lVar14 + 8];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 8);
  lVar14 = 0;
  do {
    if ((pcMesh->mColors[lVar14] == (aiColor4D *)0x0) || (pcMesh->mNumVertices == 0)) break;
    if (pcMesh->mColors[lVar14] != (aiColor4D *)0x0) {
      operator_delete__(pcMesh->mColors[lVar14]);
    }
    pcMesh->mColors[lVar14] = (aiColor4D *)local_b8[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 8);
  pcMesh->mNumVertices = (uint)local_108;
  if ((int)uVar19 != 0 && pcMesh->mNormals != (aiVector3D *)0x0) {
    operator_delete__(pcMesh->mNormals);
    pcMesh->mNormals = local_f0;
  }
  paVar9 = pcMesh->mTangents;
  if (((paVar9 != (aiVector3D *)0x0) && (pcMesh->mBitangents != (aiVector3D *)0x0)) &&
     (pcMesh->mNumVertices != 0)) {
    if (paVar9 != (aiVector3D *)0x0) {
      operator_delete__(paVar9);
    }
    pcMesh->mTangents = local_f8;
    if (pcMesh->mBitangents != (aiVector3D *)0x0) {
      operator_delete__(pcMesh->mBitangents);
    }
    pcMesh->mBitangents = local_100;
  }
  return pcMesh->mNumVertices != uVar16;
}

Assistant:

bool MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    unsigned int iOldNumVertices = pcMesh->mNumVertices;
    const unsigned int iNumVerts = pcMesh->mNumFaces*3;

    aiVector3D* pvPositions = new aiVector3D[ iNumVerts ];

    aiVector3D* pvNormals = NULL;
    if (pcMesh->HasNormals())
    {
        pvNormals = new aiVector3D[iNumVerts];
    }
    aiVector3D* pvTangents = NULL, *pvBitangents = NULL;
    if (pcMesh->HasTangentsAndBitangents())
    {
        pvTangents = new aiVector3D[iNumVerts];
        pvBitangents = new aiVector3D[iNumVerts];
    }

    aiVector3D* apvTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS] = {0};
    aiColor4D* apvColorSets[AI_MAX_NUMBER_OF_COLOR_SETS] = {0};

    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
        apvTextureCoords[p++] = new aiVector3D[iNumVerts];

    p = 0;
    while (pcMesh->HasVertexColors(p))
        apvColorSets[p++] = new aiColor4D[iNumVerts];

    // allocate enough memory to hold output bones and vertex weights ...
    std::vector<aiVertexWeight>* newWeights = new std::vector<aiVertexWeight>[pcMesh->mNumBones];
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i) {
        newWeights[i].reserve(pcMesh->mBones[i]->mNumWeights*3);
    }

    // iterate through all faces and build a clean list
    unsigned int iIndex = 0;
    for (unsigned int a = 0; a< pcMesh->mNumFaces;++a)
    {
        aiFace* pcFace = &pcMesh->mFaces[a];
        for (unsigned int q = 0; q < pcFace->mNumIndices;++q,++iIndex)
        {
            // need to build a clean list of bones, too
            for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
            {
                for (unsigned int a = 0;  a < pcMesh->mBones[i]->mNumWeights;a++)
                {
                    const aiVertexWeight& w = pcMesh->mBones[i]->mWeights[a];
                    if(pcFace->mIndices[q] == w.mVertexId)
                    {
                        aiVertexWeight wNew;
                        wNew.mVertexId = iIndex;
                        wNew.mWeight = w.mWeight;
                        newWeights[i].push_back(wNew);
                    }
                }
            }

            pvPositions[iIndex] = pcMesh->mVertices[pcFace->mIndices[q]];

            if (pcMesh->HasNormals())
            {
                pvNormals[iIndex] = pcMesh->mNormals[pcFace->mIndices[q]];
            }
            if (pcMesh->HasTangentsAndBitangents())
            {
                pvTangents[iIndex] = pcMesh->mTangents[pcFace->mIndices[q]];
                pvBitangents[iIndex] = pcMesh->mBitangents[pcFace->mIndices[q]];
            }

            unsigned int p = 0;
            while (pcMesh->HasTextureCoords(p))
            {
                apvTextureCoords[p][iIndex] = pcMesh->mTextureCoords[p][pcFace->mIndices[q]];
                ++p;
            }
            p = 0;
            while (pcMesh->HasVertexColors(p))
            {
                apvColorSets[p][iIndex] = pcMesh->mColors[p][pcFace->mIndices[q]];
                ++p;
            }
            pcFace->mIndices[q] = iIndex;
        }
    }



    // build output vertex weights
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
    {
        delete [] pcMesh->mBones[i]->mWeights;
        if (!newWeights[i].empty()) {
            pcMesh->mBones[i]->mWeights = new aiVertexWeight[newWeights[i].size()];
            aiVertexWeight *weightToCopy = &( newWeights[i][0] );
            memcpy(pcMesh->mBones[i]->mWeights, weightToCopy,
                sizeof(aiVertexWeight) * newWeights[i].size());
        } else {
            pcMesh->mBones[i]->mWeights = NULL;
        }
    }
    delete[] newWeights;

    // delete the old members
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pvPositions;

    p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        delete[] pcMesh->mTextureCoords[p];
        pcMesh->mTextureCoords[p] = apvTextureCoords[p];
        ++p;
    }
    p = 0;
    while (pcMesh->HasVertexColors(p))
    {
        delete[] pcMesh->mColors[p];
        pcMesh->mColors[p] = apvColorSets[p];
        ++p;
    }
    pcMesh->mNumVertices = iNumVerts;

    if (pcMesh->HasNormals())
    {
        delete[] pcMesh->mNormals;
        pcMesh->mNormals = pvNormals;
    }
    if (pcMesh->HasTangentsAndBitangents())
    {
        delete[] pcMesh->mTangents;
        pcMesh->mTangents = pvTangents;
        delete[] pcMesh->mBitangents;
        pcMesh->mBitangents = pvBitangents;
    }
    return (pcMesh->mNumVertices != iOldNumVertices);
}